

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

char * __thiscall
tetgenio::readnumberline(tetgenio *this,char *string,FILE *infile,char *infilename)

{
  bool bVar1;
  char *local_38;
  char *result;
  char *infilename_local;
  FILE *infile_local;
  char *string_local;
  tetgenio *this_local;
  
  do {
    local_38 = fgets(string,0x800,(FILE *)infile);
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
    while( true ) {
      bVar1 = false;
      if ((((*local_38 != '\0') && (bVar1 = false, *local_38 != '#')) &&
          (bVar1 = false, *local_38 != '.')) &&
         (((bVar1 = false, *local_38 != '+' && (bVar1 = false, *local_38 != '-')) &&
          (bVar1 = true, '/' < *local_38)))) {
        bVar1 = '9' < *local_38;
      }
      if (!bVar1) break;
      local_38 = local_38 + 1;
    }
    bVar1 = true;
    if (*local_38 != '#') {
      bVar1 = *local_38 == '\0';
    }
  } while (bVar1);
  return local_38;
}

Assistant:

char* tetgenio::readnumberline(char *string, FILE *infile, char *infilename)
{
  char *result;

  // Search for something that looks like a number.
  do {
    result = fgets(string, INPUTLINESIZE, infile);
    if (result == (char *) NULL) {
      return result;
    }
    // Skip anything that doesn't look like a number, a comment, 
    //   or the end of a line. 
    while ((*result != '\0') && (*result != '#')
           && (*result != '.') && (*result != '+') && (*result != '-')
           && ((*result < '0') || (*result > '9'))) {
      result++;
    }
    // If it's a comment or end of line, read another line and try again.
  } while ((*result == '#') || (*result == '\0'));
  return result;
}